

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

int v_hofstadter(int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = 0;
  do {
    if (n < 1) {
LAB_001d437a:
      return iVar3 + iVar4;
    }
    if (n < 5) {
      iVar4 = 1;
      goto LAB_001d437a;
    }
    iVar1 = v_hofstadter(n + -1);
    iVar1 = v_hofstadter(n - iVar1);
    iVar2 = v_hofstadter(n + -4);
    n = n - iVar2;
    iVar3 = iVar3 + iVar1;
  } while( true );
}

Assistant:

int v_hofstadter ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    V_HOFSTADTER computes the Hofstadter V sequence.
//
//  Discussion:
//
//    V(N) = 0                          if N = 0
//         = 1                          if 1 <= N <= 4
//         = V(N-V(N-1)) + V(N-V(N-4)), otherwise.
//
//    V(N) is defined for all nonnegative integers.
//
//  Table:
//
//     N  V(N)
//    --  ----
//
//     0     0
//     1     1
//     2     1
//     3     1
//     4     1
//     5     2
//     6     3
//     7     4
//     8     5
//     9     5
//    10     6
//    11     6
//    12     7
//    13     8
//    14     8
//    15     9
//    16     9
//    17    10
//    18    11
//    19    11
//    20    11
//    21    12
//    22    12
//    23    13
//    24    14
//    25    14
//    26    15
//    27    15
//    28    16
//    29    17
//    30    17
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the argument of the function.
//
//    Output, int V_HOFSTADTER, the value of the function.
//
{
  if ( n <= 0 )
  {
    return 0;
  }
  else if ( n <= 4 )
  {
    return 1;
  }
  else
  {
    return (  v_hofstadter ( n - v_hofstadter(n-1) ) 
           + v_hofstadter ( n - v_hofstadter(n-4) ) );
  }

}